

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void kratos::infer_property_clocking(Generator *top)

{
  undefined1 local_58 [8];
  AssertPropertyVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_58 = (undefined1  [8])&PTR_visit_root_002d6fb8;
  IRVisitor::visit_root_s((IRVisitor *)local_58,&top->super_IRNode);
  IRVisitor::~IRVisitor((IRVisitor *)local_58);
  return;
}

Assistant:

void infer_property_clocking(Generator* top) {
    AssertPropertyVisitor visitor;
    visitor.visit_root_s(top);
}